

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O1

void __thiscall FDynamicBuffer::SetData(FDynamicBuffer *this,BYTE *data,int len)

{
  uint uVar1;
  BYTE *pBVar2;
  
  if (this->m_BufferLen < len) {
    uVar1 = len + 0xffU & 0xffffff00;
    this->m_BufferLen = uVar1;
    pBVar2 = (BYTE *)M_Realloc_Dbg(this->m_Data,(long)(int)uVar1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/d_net.cpp"
                                   ,0x808);
    this->m_Data = pBVar2;
  }
  if (data != (BYTE *)0x0) {
    this->m_Len = len;
    memcpy(this->m_Data,data,(long)len);
    return;
  }
  this->m_Len = 0;
  return;
}

Assistant:

void FDynamicBuffer::SetData (const BYTE *data, int len)
{
	if (len > m_BufferLen)
	{
		m_BufferLen = (len + 255) & ~255;
		m_Data = (BYTE *)M_Realloc (m_Data, m_BufferLen);
	}
	if (data != NULL)
	{
		m_Len = len;
		memcpy (m_Data, data, len);
	}
	else 
	{
		m_Len = 0;
	}
}